

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  long *plVar1;
  long lVar2;
  size_type __new_size;
  ifstream file;
  char acStack_218 [520];
  
  std::ifstream::ifstream(acStack_218,(filename->_M_dataplus)._M_p,_S_in|_S_bin|_S_ate);
  plVar1 = (long *)std::istream::seekg((long)acStack_218,_S_beg);
  if (*(int *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) == 0) {
    __new_size = std::istream::tellg();
  }
  else {
    __new_size = 0;
  }
  plVar1 = (long *)std::istream::seekg((long)acStack_218,_S_beg);
  if (*(int *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) == 0) {
    lVar2 = std::istream::tellg();
    __new_size = __new_size - lVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,__new_size);
  if (0 < (long)__new_size) {
    std::istream::read(acStack_218,
                       (long)(buffer->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(acStack_218);
  return;
}

Assistant:

void load_file(std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ifstream file(filename.c_str(), std::ios::in|std::ios::binary|std::ios::ate);

  /*get filesize*/
  std::streamsize size = 0;
  if(file.seekg(0, std::ios::end).good()) size = file.tellg();
  if(file.seekg(0, std::ios::beg).good()) size -= file.tellg();

  /*read contents of the file into the vector*/
  buffer.resize(size_t(size));
  if(size > 0) file.read((char*)(&buffer[0]), size);
}